

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

void __thiscall TasgridWrapper::loadComputedValues(TasgridWrapper *this)

{
  pointer pdVar1;
  pointer pdVar2;
  Data2D<double> x;
  Data2D<double> v;
  Data2D<double> local_98;
  Data2D<double> local_70;
  pointer local_48;
  pointer pdStack_40;
  pointer local_38;
  pointer local_28;
  pointer pdStack_20;
  pointer local_18;
  
  verifiedRead(&local_70,this,&this->valsfilename,this->num_outputs);
  if (this->command == command_loadvalues) {
    local_98.stride =
         (size_t)local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_98.num_strips =
         (size_t)local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)this);
    pdVar1 = (pointer)local_98.stride;
    pdVar2 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if (this->field_0x70 == '\0') {
      TasGrid::TasmanianSparseGrid::beginConstruction();
    }
    verifiedRead(&local_98,this,&this->xfilename,this->num_dimensions);
    local_28 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdStack_20 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_18 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_48 = local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    pdStack_40 = local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_38 = local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::loadConstructedPoints((vector *)this,(vector *)&local_28);
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    pdVar1 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (local_28 != (pointer)0x0) {
      operator_delete(local_28,(long)local_18 - (long)local_28);
      pdVar1 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = local_98.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  if (local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::loadComputedValues(){
    auto v = verifiedRead(valsfilename, num_outputs);
    if (command == command_loadvalues){
        grid.loadNeededValues(v.release());
    }else{
        if (not grid.isUsingConstruction())
            grid.beginConstruction();
        auto x = verifiedRead(xfilename, num_dimensions);
        grid.loadConstructedPoints(x.release(), v.release());
    }
}